

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::log<char_const(&)[85],int,int>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [85],
               int *params_1,int *params_2)

{
  undefined4 in_register_00000014;
  int *params_00;
  int *params_01;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> in_stack_fffffffffffffef8;
  ArrayDisposer **local_d0;
  undefined1 local_78 [8];
  String argValues [3];
  int *params_local_1;
  char (*params_local) [85];
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  
  argValues[2].content.disposer = (ArrayDisposer *)params_1;
  str<char_const(&)[85]>
            ((String *)local_78,(kj *)params,(char (*) [85])CONCAT44(in_register_00000014,severity))
  ;
  str<int&>((String *)&argValues[0].content.disposer,(kj *)argValues[2].content.disposer,params_00);
  str<int&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  AVar1 = arrayPtr<kj::String>((String *)local_78,3);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)AVar1.ptr,in_stack_fffffffffffffef8);
  local_d0 = &argValues[2].content.disposer;
  do {
    local_d0 = local_d0 + -3;
    String::~String((String *)local_d0);
  } while (local_d0 != (ArrayDisposer **)local_78);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}